

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c++
# Opt level: O1

void __thiscall
capnp::_::BuilderArena::BuilderArena
          (BuilderArena *this,MessageBuilder *message,
          ArrayPtr<capnp::MessageBuilder::SegmentInit> segments)

{
  ArrayPtr<const_capnp::word> *pAVar1;
  _ *p_Var2;
  Disposer *pDVar3;
  MultiSegmentState *pMVar4;
  Own<capnp::_::SegmentBuilder,_std::nullptr_t> *pOVar5;
  RemoveConst<kj::Own<capnp::_::SegmentBuilder>_> *pRVar6;
  Own<capnp::_::SegmentBuilder,_std::nullptr_t> *pOVar7;
  ArrayPtr<const_capnp::word> *pAVar8;
  RemoveConst<kj::ArrayPtr<const_capnp::word>_> *pRVar9;
  ArrayPtr<const_capnp::word> *pAVar10;
  BuilderArena *pBVar11;
  ArrayDisposer *pAVar12;
  SegmentBuilder *pSVar13;
  SegmentWordCount SVar14;
  SegmentBuilder *pSVar15;
  MultiSegmentState *pMVar16;
  ulong uVar17;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  size_t sVar18;
  ArrayDisposer *pAVar19;
  SegmentBuilder *ptrCopy;
  uint uVar20;
  SegmentInit *pSVar21;
  ArrayPtr<const_capnp::word> segment;
  ArrayPtr<const_capnp::word> segment_00;
  Vector<kj::Own<capnp::_::SegmentBuilder,_std::nullptr_t>_> builders;
  Vector<kj::ArrayPtr<const_capnp::word>_> forOutput;
  Vector<kj::Own<capnp::_::SegmentBuilder,_std::nullptr_t>_> local_d8;
  Vector<kj::ArrayPtr<const_capnp::word>_> local_b8;
  BuilderArena *local_98;
  SegmentBuilder *local_90;
  ArrayDisposer *local_88;
  SegmentBuilder *local_80;
  Own<capnp::_::SegmentBuilder,_std::nullptr_t> local_78;
  SegmentBuilder *local_68;
  ArrayDisposer *local_60;
  ArrayPtr<const_capnp::word> *local_58;
  ArrayPtr<const_capnp::word> *pAStack_50;
  ArrayPtr<const_capnp::word> *local_48;
  ArrayDisposer *local_40;
  
  uVar17 = segments.size_;
  segment.size_ = segments.ptr;
  (this->super_Arena)._vptr_Arena = (_func_int **)&PTR__BuilderArena_0026c658;
  this->message = message;
  (this->dummyLimiter).limit = 0xffffffffffffffff;
  (this->localCapTable).super_CapTableBuilder.super_CapTableReader._vptr_CapTableReader =
       (_func_int **)&PTR_extractCap_0026c710;
  (this->localCapTable).capTable.builder.ptr =
       (Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *)0x0;
  (this->localCapTable).capTable.builder.pos =
       (RemoveConst<kj::Maybe<kj::Own<capnp::ClientHook>_>_> *)0x0;
  (this->localCapTable).capTable.builder.endPtr =
       (Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *)0x0;
  (this->localCapTable).capTable.builder.disposer =
       (ArrayDisposer *)&kj::NullArrayDisposer::instance;
  p_Var2 = (_ *)((segment.size_)->space).ptr;
  segment.ptr = (word *)((segment.size_)->space).size_;
  local_98 = this;
  SVar14 = verifySegment(p_Var2,segment);
  local_78.disposer = (Disposer *)(segment.size_)->wordsUsed;
  local_d8.builder.ptr = &local_78;
  if ((Disposer *)0x1fffffff < local_78.disposer) {
    verifySegmentSize::anon_class_8_1_89918cff::operator()((anon_class_8_1_89918cff *)&local_d8);
  }
  local_80 = (SegmentBuilder *)&local_98->dummyLimiter;
  (local_98->segment0).super_SegmentReader.arena = &local_98->super_Arena;
  (local_98->segment0).super_SegmentReader.id.value = 0;
  (local_98->segment0).super_SegmentReader.ptr.ptr = (word *)p_Var2;
  (local_98->segment0).super_SegmentReader.ptr.size_ = (ulong)SVar14;
  (local_98->segment0).super_SegmentReader.readLimiter = (ReadLimiter *)local_80;
  (local_98->segment0).pos = (word *)(p_Var2 + (long)local_78.disposer * 8);
  (local_98->segment0).readOnly = false;
  (local_98->segment0ForOutput).ptr = (word *)0x0;
  (local_98->segment0ForOutput).size_ = 0;
  (local_98->moreSegments).ptr.disposer = (Disposer *)0x0;
  (local_98->moreSegments).ptr.ptr = (MultiSegmentState *)0x0;
  local_98->segmentWithSpace = (SegmentBuilder *)0x0;
  if (uVar17 < 2) {
    local_98->segmentWithSpace = &local_98->segment0;
  }
  else {
    local_d8.builder.ptr =
         (Own<capnp::_::SegmentBuilder,_std::nullptr_t> *)
         kj::_::HeapArrayDisposer::allocateImpl
                   (0x10,0,uVar17 - 1,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
    local_d8.builder.endPtr =
         (Own<capnp::_::SegmentBuilder,_std::nullptr_t> *)
         ((long)local_d8.builder.ptr + (uVar17 - 1) * 0x10);
    local_d8.builder.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    local_90 = (SegmentBuilder *)(uVar17 * 0x18);
    local_d8.builder.pos = local_d8.builder.ptr;
    local_88 = (ArrayDisposer *)uVar17;
    if (local_90 != (SegmentBuilder *)&DAT_00000018) {
      local_90 = (SegmentBuilder *)
                 ((long)&(((SegmentInit *)local_90)->space).ptr +
                 (long)&((segment.size_)->space).ptr);
      pSVar21 = segment.size_ + 1;
      uVar20 = 1;
      sVar18 = extraout_RDX;
      do {
        p_Var2 = (_ *)(pSVar21->space).ptr;
        segment_00.size_ = sVar18;
        segment_00.ptr = (word *)(pSVar21->space).size_;
        SVar14 = verifySegment(p_Var2,segment_00);
        pDVar3 = (Disposer *)pSVar21->wordsUsed;
        local_b8.builder.ptr = (ArrayPtr<const_capnp::word> *)&local_78;
        local_78.disposer = pDVar3;
        if ((Disposer *)0x1fffffff < pDVar3) {
          verifySegmentSize::anon_class_8_1_89918cff::operator()
                    ((anon_class_8_1_89918cff *)&local_b8);
        }
        pSVar15 = (SegmentBuilder *)operator_new(0x38);
        (pSVar15->super_SegmentReader).arena = &local_98->super_Arena;
        (pSVar15->super_SegmentReader).id.value = uVar20;
        (pSVar15->super_SegmentReader).ptr.ptr = (word *)p_Var2;
        (pSVar15->super_SegmentReader).ptr.size_ = (ulong)SVar14;
        (pSVar15->super_SegmentReader).readLimiter = (ReadLimiter *)local_80;
        pSVar15->pos = (word *)(p_Var2 + (long)pDVar3 * 8);
        pSVar15->readOnly = false;
        sVar18 = extraout_RDX_00;
        if (local_d8.builder.pos == local_d8.builder.endPtr) {
          sVar18 = (long)local_d8.builder.endPtr - (long)local_d8.builder.ptr >> 3;
          if (local_d8.builder.endPtr == local_d8.builder.ptr) {
            sVar18 = 4;
          }
          kj::Vector<kj::Own<capnp::_::SegmentBuilder,_std::nullptr_t>_>::setCapacity
                    (&local_d8,sVar18);
          sVar18 = extraout_RDX_01;
        }
        ((SegmentReader *)&(local_d8.builder.pos)->disposer)->arena =
             (Arena *)&kj::_::HeapDisposer<capnp::_::SegmentBuilder>::instance;
        *(SegmentBuilder **)&((SegmentReader *)&(local_d8.builder.pos)->disposer)->id = pSVar15;
        local_d8.builder.pos =
             (RemoveConst<kj::Own<capnp::_::SegmentBuilder>_> *)
             &((SegmentReader *)&(local_d8.builder.pos)->disposer)->ptr;
        pSVar21 = pSVar21 + 1;
        uVar20 = uVar20 + 1;
      } while ((SegmentBuilder *)pSVar21 != local_90);
    }
    pAVar12 = local_88;
    local_b8.builder.ptr = (ArrayPtr<const_capnp::word> *)0x0;
    local_b8.builder.pos = (ArrayPtr<const_capnp::word> *)0x0;
    local_b8.builder.endPtr = (ArrayPtr<const_capnp::word> *)0x0;
    local_b8.builder.disposer = (ArrayDisposer *)&kj::NullArrayDisposer::instance;
    if (local_88 != (ArrayDisposer *)0x0) {
      pAVar19 = (ArrayDisposer *)4;
      if (4 < local_88) {
        pAVar19 = local_88;
      }
      kj::Vector<kj::ArrayPtr<const_capnp::word>_>::setCapacity(&local_b8,(size_t)pAVar19);
    }
    pBVar11 = local_98;
    pAVar19 = local_b8.builder.disposer;
    pAVar10 = local_b8.builder.endPtr;
    pAVar8 = local_b8.builder.ptr;
    pRVar6 = local_d8.builder.pos;
    pAVar1 = local_b8.builder.ptr + (long)pAVar12;
    while (local_b8.builder.pos < local_b8.builder.ptr + (long)pAVar12) {
      (local_b8.builder.pos)->ptr = (word *)0x0;
      (local_b8.builder.pos)->size_ = 0;
      pAVar1 = local_b8.builder.pos + 1;
      local_b8.builder.pos = pAVar1;
    }
    local_98->segmentWithSpace =
         *(SegmentBuilder **)&((SegmentBuilder *)((long)local_d8.builder.pos + -0x38))->readOnly;
    local_90 = (SegmentBuilder *)local_d8.builder.ptr;
    local_78.disposer = (Disposer *)local_d8.builder.ptr;
    local_78.ptr = (SegmentBuilder *)local_d8.builder.pos;
    local_80 = (SegmentBuilder *)local_d8.builder.endPtr;
    local_68 = (SegmentBuilder *)local_d8.builder.endPtr;
    local_88 = local_d8.builder.disposer;
    local_60 = local_d8.builder.disposer;
    local_d8.builder.ptr = (Own<capnp::_::SegmentBuilder,_std::nullptr_t> *)0x0;
    local_d8.builder.pos = (RemoveConst<kj::Own<capnp::_::SegmentBuilder>_> *)0x0;
    local_d8.builder.endPtr = (Own<capnp::_::SegmentBuilder,_std::nullptr_t> *)0x0;
    local_58 = local_b8.builder.ptr;
    local_48 = local_b8.builder.endPtr;
    local_40 = local_b8.builder.disposer;
    local_b8.builder.ptr = (ArrayPtr<const_capnp::word> *)0x0;
    local_b8.builder.pos = (RemoveConst<kj::ArrayPtr<const_capnp::word>_> *)0x0;
    local_b8.builder.endPtr = (ArrayPtr<const_capnp::word> *)0x0;
    pAStack_50 = pAVar1;
    pMVar16 = (MultiSegmentState *)operator_new(0x40);
    (pMVar16->builders).builder.ptr = (Own<capnp::_::SegmentBuilder,_std::nullptr_t> *)local_90;
    (pMVar16->builders).builder.pos = pRVar6;
    (pMVar16->builders).builder.endPtr = (Own<capnp::_::SegmentBuilder,_std::nullptr_t> *)local_80;
    (pMVar16->builders).builder.disposer = local_88;
    local_68 = (SegmentBuilder *)0x0;
    local_78.disposer = (Disposer *)0x0;
    local_78.ptr = (SegmentBuilder *)0x0;
    (pMVar16->forOutput).builder.ptr = pAVar8;
    (pMVar16->forOutput).builder.pos = pAVar1;
    (pMVar16->forOutput).builder.endPtr = pAVar10;
    (pMVar16->forOutput).builder.disposer = pAVar19;
    local_48 = (ArrayPtr<const_capnp::word> *)0x0;
    local_58 = (ArrayPtr<const_capnp::word> *)0x0;
    pAStack_50 = (ArrayPtr<const_capnp::word> *)0x0;
    pDVar3 = (pBVar11->moreSegments).ptr.disposer;
    pMVar4 = (pBVar11->moreSegments).ptr.ptr;
    (pBVar11->moreSegments).ptr.disposer =
         (Disposer *)&kj::_::HeapDisposer<capnp::_::BuilderArena::MultiSegmentState>::instance;
    (pBVar11->moreSegments).ptr.ptr = pMVar16;
    if (pMVar4 != (MultiSegmentState *)0x0) {
      (**pDVar3->_vptr_Disposer)();
    }
    pAVar10 = local_48;
    pAVar8 = pAStack_50;
    pAVar1 = local_58;
    if (local_58 != (ArrayPtr<const_capnp::word> *)0x0) {
      local_58 = (ArrayPtr<const_capnp::word> *)0x0;
      pAStack_50 = (ArrayPtr<const_capnp::word> *)0x0;
      local_48 = (ArrayPtr<const_capnp::word> *)0x0;
      (**local_40->_vptr_ArrayDisposer)
                (local_40,pAVar1,0x10,(long)pAVar8 - (long)pAVar1 >> 4,
                 (long)pAVar10 - (long)pAVar1 >> 4,0);
    }
    pSVar13 = local_68;
    pSVar15 = local_78.ptr;
    pDVar3 = local_78.disposer;
    if (local_78.disposer != (Disposer *)0x0) {
      local_78.disposer = (Disposer *)0x0;
      local_78.ptr = (SegmentBuilder *)0x0;
      local_68 = (SegmentBuilder *)0x0;
      (**local_60->_vptr_ArrayDisposer)
                (local_60,pDVar3,0x10,(long)pSVar15 - (long)pDVar3 >> 4,
                 (long)pSVar13 - (long)pDVar3 >> 4,
                 kj::ArrayDisposer::Dispose_<kj::Own<capnp::_::SegmentBuilder,_std::nullptr_t>_>::
                 destruct);
    }
    pAVar8 = local_b8.builder.endPtr;
    pRVar9 = local_b8.builder.pos;
    pAVar1 = local_b8.builder.ptr;
    if (local_b8.builder.ptr != (ArrayPtr<const_capnp::word> *)0x0) {
      local_b8.builder.ptr = (ArrayPtr<const_capnp::word> *)0x0;
      local_b8.builder.pos = (RemoveConst<kj::ArrayPtr<const_capnp::word>_> *)0x0;
      local_b8.builder.endPtr = (ArrayPtr<const_capnp::word> *)0x0;
      (**(local_b8.builder.disposer)->_vptr_ArrayDisposer)
                (local_b8.builder.disposer,pAVar1,0x10,(long)pRVar9 - (long)pAVar1 >> 4,
                 (long)pAVar8 - (long)pAVar1 >> 4,0);
    }
    pOVar7 = local_d8.builder.endPtr;
    pRVar6 = local_d8.builder.pos;
    pOVar5 = local_d8.builder.ptr;
    if (local_d8.builder.ptr != (Own<capnp::_::SegmentBuilder,_std::nullptr_t> *)0x0) {
      local_d8.builder.ptr = (Own<capnp::_::SegmentBuilder,_std::nullptr_t> *)0x0;
      local_d8.builder.pos = (RemoveConst<kj::Own<capnp::_::SegmentBuilder>_> *)0x0;
      local_d8.builder.endPtr = (Own<capnp::_::SegmentBuilder,_std::nullptr_t> *)0x0;
      (**(local_d8.builder.disposer)->_vptr_ArrayDisposer)
                (local_d8.builder.disposer,pOVar5,0x10,(long)pRVar6 - (long)pOVar5 >> 4,
                 (long)pOVar7 - (long)pOVar5 >> 4,
                 kj::ArrayDisposer::Dispose_<kj::Own<capnp::_::SegmentBuilder,_std::nullptr_t>_>::
                 destruct);
    }
  }
  return;
}

Assistant:

BuilderArena::BuilderArena(MessageBuilder* message,
                           kj::ArrayPtr<MessageBuilder::SegmentInit> segments)
    : message(message),
      segment0(this, SegmentId(0), segments[0].space.begin(),
               verifySegment(segments[0].space),
               &this->dummyLimiter, verifySegmentSize(segments[0].wordsUsed)) {
  if (segments.size() > 1) {
    kj::Vector<kj::Own<SegmentBuilder>> builders(segments.size() - 1);

    uint i = 1;
    for (auto& segment: segments.slice(1, segments.size())) {
      builders.add(kj::heap<SegmentBuilder>(
          this, SegmentId(i++), segment.space.begin(), verifySegment(segment.space),
          &this->dummyLimiter, verifySegmentSize(segment.wordsUsed)));
    }

    kj::Vector<kj::ArrayPtr<const word>> forOutput;
    forOutput.resize(segments.size());

    segmentWithSpace = builders.back();

    this->moreSegments = kj::heap<MultiSegmentState>(
        MultiSegmentState { kj::mv(builders), kj::mv(forOutput) });

  } else {
    segmentWithSpace = &segment0;
  }
}